

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall StandardOutput::StandardOutput(StandardOutput *this)

{
  int iVar1;
  char *__s1;
  Output *in_RDI;
  char *term;
  bool local_11;
  
  Output::Output(in_RDI);
  in_RDI->_vptr_Output = (_func_int **)&PTR__StandardOutput_0029b860;
  iVar1 = fileno(_stdout);
  iVar1 = isatty(iVar1);
  *(bool *)&in_RDI[1]._vptr_Output = iVar1 != 0;
  __s1 = getenv("TERM");
  local_11 = false;
  if ((((ulong)in_RDI[1]._vptr_Output & 1) != 0) && (local_11 = false, __s1 != (char *)0x0)) {
    iVar1 = strcmp(__s1,"dumb");
    local_11 = iVar1 != 0;
  }
  *(bool *)&in_RDI[1]._vptr_Output = local_11;
  return;
}

Assistant:

StandardOutput()
	{
		istty = isatty(fileno(stdout)) != 0;

	#ifndef _WIN32
		const char* term = getenv("TERM");

		istty = istty && term && strcmp(term, "dumb") != 0;
	#endif

	#ifdef _WIN32
		if (istty)
			SetConsoleOutputCP(CP_UTF8);
	#endif
	}